

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

int __thiscall QTextDocumentPrivate::remove(QTextDocumentPrivate *this,char *__filename)

{
  undefined1 *puVar1;
  Span *pSVar2;
  QTextCursorPrivate *this_00;
  AdjustResult AVar3;
  Operation in_ECX;
  ulong uVar4;
  int in_EDX;
  long in_FS_OFFSET;
  piter local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX != 0) {
    this->field_0x294 = this->field_0x294 | 2;
    move(this,(int)__filename,-1,in_EDX,in_ECX);
    this->field_0x294 = this->field_0x294 & 0xfd;
    local_48 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::begin(&(this->cursors).q_hash);
    while( true ) {
      if (local_48.d == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0 &&
          local_48.bucket == 0) break;
      pSVar2 = (local_48.d)->spans;
      uVar4 = local_48.bucket >> 7;
      this_00 = *(QTextCursorPrivate **)
                 pSVar2[uVar4].entries[pSVar2[uVar4].offsets[(uint)local_48.bucket & 0x7f]].storage.
                 data;
      AVar3 = QTextCursorPrivate::adjustPosition(this_00,(int)__filename,-in_EDX,in_ECX);
      if (AVar3 == CursorMoved) {
        puVar1 = &this_00->field_0x28;
        *puVar1 = *puVar1 | 4;
      }
      QHashPrivate::iterator<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::operator++
                (&local_48);
    }
    finishEdit(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::remove(int pos, int length, QTextUndoCommand::Operation op)
{
    if (length == 0)
        return;
    blockCursorAdjustment = true;
    move(pos, -1, length, op);
    blockCursorAdjustment = false;
    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        if (curs->adjustPosition(pos, -length, op) == QTextCursorPrivate::CursorMoved) {
            curs->changed = true;
        }
    }
    finishEdit();
}